

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkDfsBoxes(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long *plVar6;
  uint uVar7;
  Abc_Obj_t *pNode;
  int iVar8;
  long lVar9;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                  ,0x6d,"Vec_Ptr_t *Abc_NtkDfsBoxes(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar3 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    if (-500 < iVar2) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar4 = (void **)malloc(800);
    vNodes->pArray = ppvVar4;
    pVVar5 = pNtk->vPos;
    if (0 < pVVar5->nSize) {
      lVar9 = 0;
      do {
        plVar6 = (long *)pVVar5->pArray[lVar9];
        uVar7 = *(uint *)((long)plVar6 + 0x14) & 0xf;
        if ((*(uint *)((long)plVar6 + 0x14) & 0xe) == 8 || uVar7 == 10) {
          plVar6 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8
                             );
        }
        else if ((uVar7 | 4) != 7) {
          __assert_fail("Abc_ObjIsPo(pObj) || Abc_ObjIsNode(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieCec.c"
                        ,0x38,"Abc_Obj_t *Abc_ObjFaninReal(Abc_Obj_t *, int)");
        }
        plVar6 = *(long **)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
        pNode = *(Abc_Obj_t **)
                 (*(long *)(*(long *)(*plVar6 + 0x20) + 8) + (long)*(int *)plVar6[4] * 8);
        if ((*(uint *)&pNode->field_0x14 & 0xf) == 5) {
          pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray];
        }
        Abc_NtkDfsBoxes_rec(pNode,vNodes);
        lVar9 = lVar9 + 1;
        pVVar5 = pNtk->vPos;
      } while (lVar9 < pVVar5->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsBoxes( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsBoxes_rec( Abc_ObjFaninReal(pObj, 0), vNodes );
    return vNodes;
}